

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

void __thiscall Fl_Check_Browser::clear(Fl_Check_Browser *this)

{
  cb_item *pcVar1;
  cb_item *next;
  cb_item *p;
  Fl_Check_Browser *this_local;
  
  next = this->first;
  if (next != (cb_item *)0x0) {
    Fl_Browser_::new_list(&this->super_Fl_Browser_);
    do {
      pcVar1 = next->next;
      free(next->text);
      free(next);
      next = pcVar1;
    } while (pcVar1 != (cb_item *)0x0);
    this->last = (cb_item *)0x0;
    this->first = (cb_item *)0x0;
    this->nchecked_ = 0;
    this->nitems_ = 0;
    this->cached_item = -1;
  }
  return;
}

Assistant:

void Fl_Check_Browser::clear() {
	cb_item *p = first;
	cb_item *next;

	if (p == 0) {
		return;
	}

	new_list();
	do {
		next = p->next;
		free(p->text);
		free(p);
		p = next;
	} while (p);

	first = last = 0;
	nitems_ = nchecked_ = 0;
	cached_item = -1;
}